

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O1

void __thiscall
slang::FormatBuffer::format<unsigned_long>
          (FormatBuffer *this,text_style *style,format_string<unsigned_long> fmt,unsigned_long *args
          )

{
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  unsigned_long local_18 [3];
  
  if (this->showColors == false) {
    local_18[0] = *args;
    args_01.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_18;
    args_01.desc_ = 4;
    ::fmt::v9::detail::vformat_to<char>((buffer<char> *)this,fmt.str_,args_01,(locale_ref)0x0);
  }
  else {
    local_18[0] = *args;
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_18;
    args_00.desc_ = 4;
    ::fmt::v9::detail::vformat_to<char>((buffer<char> *)this,style,fmt.str_,args_00);
  }
  return;
}

Assistant:

void format(const fmt::text_style& style, fmt::format_string<Args...> fmt, Args&&... args) {
        if (!showColors) {
            fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
        }
        else {
            fmt::detail::vformat_to(buf, style, fmt::string_view(fmt),
                                    fmt::make_format_args(args...));
        }
    }